

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::EntryPointInfo::ProcessJitTransferData(EntryPointInfo *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ScriptContext *scriptContext_00;
  ScriptContext *scriptContext;
  AutoCleanup autoCleanup;
  JitTransferData *jitTransferData;
  EntryPointInfo *this_local;
  
  bVar2 = IsCleanedUp(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x2089,"(!IsCleanedUp())","!IsCleanedUp()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  autoCleanup.entryPointInfo = (EntryPointInfo *)GetJitTransferData(this);
  if ((JitTransferData *)autoCleanup.entryPointInfo != (JitTransferData *)0x0) {
    ProcessJitTransferData()::AutoCleanup::AutoCleanup(Js::EntryPointInfo__(&scriptContext,this);
    scriptContext_00 = GetScriptContext(this);
    bVar2 = JitTransferData::GetIsReady((JitTransferData *)autoCleanup.entryPointInfo);
    if (bVar2) {
      PinTypeRefs(this,scriptContext_00);
      InstallGuards(this,scriptContext_00);
    }
    FreeJitTransferData(this);
    ProcessJitTransferData::AutoCleanup::Done((AutoCleanup *)&scriptContext);
    ProcessJitTransferData::AutoCleanup::~AutoCleanup((AutoCleanup *)&scriptContext);
  }
  return;
}

Assistant:

void EntryPointInfo::ProcessJitTransferData()
    {
        Assert(!IsCleanedUp());

        auto jitTransferData = GetJitTransferData();
        if (jitTransferData == nullptr)
        {
            return;
        }

        class AutoCleanup
        {
            EntryPointInfo *entryPointInfo;
        public:
            AutoCleanup(EntryPointInfo *entryPointInfo) : entryPointInfo(entryPointInfo)
            {
            }

            void Done()
            {
                entryPointInfo = nullptr;
            }
            ~AutoCleanup()
            {
                if (entryPointInfo)
                {
                    entryPointInfo->OnNativeCodeInstallFailure();
                }
            }
        } autoCleanup(this);


        ScriptContext* scriptContext = GetScriptContext();

        if (jitTransferData->GetIsReady())
        {
            PinTypeRefs(scriptContext);
            InstallGuards(scriptContext);
        }

        FreeJitTransferData();

        autoCleanup.Done();
    }